

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommands
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs,
          cmGeneratorTarget *target,string *relative)

{
  pointer pcVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer cc;
  cmCustomCommandGenerator ccg;
  undefined8 in_stack_fffffffffffffdd0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_210;
  bool local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  undefined8 uStack_1d0;
  string local_1c0;
  cmCustomCommandGenerator local_190;
  
  cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (cc != pcVar1) {
    do {
      GetConfigName_abi_cxx11_(&local_1c0,this);
      local_1f0 = false;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = (code *)0x0;
      uStack_1d0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffdd0;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_1e8;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)commands;
      computeInternalDepfile._M_invoker = (_Invoker_type)target;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_190,cc,&local_1c0,(cmLocalGenerator *)this,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_210,computeInternalDepfile);
      if (local_1d8 != (code *)0x0) {
        (*local_1d8)(&local_1e8,&local_1e8,3);
      }
      if (local_1f0 == true) {
        local_1f0 = false;
        if (local_210._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_210._M_value + 0x10))
        {
          operator_delete((void *)local_210._M_value._M_dataplus._M_p,local_210._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      AppendCustomCommand(this,commands,&local_190,target,relative,true,(ostream *)0x0);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_190);
      cc = cc + 1;
    } while (cc != pcVar1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommands(
  std::vector<std::string>& commands, const std::vector<cmCustomCommand>& ccs,
  cmGeneratorTarget* target, std::string const& relative)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->GetConfigName(), this);
    this->AppendCustomCommand(commands, ccg, target, relative, true);
  }
}